

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintestlogger.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_9fc87::FixedBufString<1022>::appendScaled<1000>
          (FixedBufString<1022> *this,qreal value,char *unit)

{
  byte *pbVar1;
  char *args_2;
  char *pcVar2;
  long in_FS_OFFSET;
  ulong uVar3;
  double dVar4;
  ushort local_a;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = -(ulong)(value < -value);
  if (1.0 <= (double)(~uVar3 & (ulong)value | (ulong)-value & uVar3)) {
    pbVar1 = &DAT_0014d147;
    args_2 = (char *)0x1;
    do {
      pcVar2 = args_2;
      args_2 = (char *)((long)pcVar2 * 1000);
      pbVar1 = pbVar1 + 1;
    } while ((double)(long)args_2 < value);
    dVar4 = (double)(long)pcVar2;
  }
  else {
    dVar4 = 0.0;
    args_2 = (char *)0x7;
    pbVar1 = &(anonymous_namespace)::submultiplePrefixes;
    do {
      if (value * 0.0 <= 1000.0) goto LAB_0011e0f6;
      args_2 = args_2 + -1;
    } while (args_2 != (char *)0x0);
    pbVar1 = &DAT_0014d669;
  }
LAB_0011e0f6:
  local_a = (ushort)*pbVar1;
  (anonymous_namespace)::FixedBufString<1022>::appendf<double,char*,char_const*>
            ((FixedBufString<1022> *)this,(char *)&local_a,value / dVar4,unit,args_2);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void appendScaled(qreal value, const char *unit)
    {
        char prefix[2] = {};
        qreal v = qAbs(value);
        qint64 ratio;
        if (v < 1 && Power == 1000) {
            const char *prefixes = submultiplePrefixes;
            ratio = qreal(std::atto::num) / qreal(std::atto::den);
            while (value * ratio > 1000 && *prefixes) {
                ++prefixes;
                ratio *= 1000;
            }
            prefix[0] = *prefixes;
        } else {
            const char *prefixes = multiplePrefixes;
            ratio = 1;
            while (value > 1000 * ratio) {  // yes, even for binary
                ++prefixes;
                ratio *= Power;
            }
            prefix[0] = *prefixes;
        }

        // adjust the value by the ratio
        value /= ratio;
        appendf(", %.3g %s%s", value, prefix, unit);
    }